

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::token_base_*>,_phmap::priv::HashEq<cs::token_base_*,_void>::Hash,_phmap::priv::HashEq<cs::token_base_*,_void>::Eq,_std::allocator<cs::token_base_*>_>
::raw_hash_set(raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::token_base_*>,_phmap::priv::HashEq<cs::token_base_*,_void>::Hash,_phmap::priv::HashEq<cs::token_base_*,_void>::Eq,_std::allocator<cs::token_base_*>_>
               *this)

{
  ctrl_t *pcVar1;
  undefined8 *in_RDI;
  undefined1 local_b [11];
  
  pcVar1 = EmptyGroup();
  *in_RDI = pcVar1;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  std::allocator<cs::token_base_*>::allocator((allocator<cs::token_base_*> *)0x218211);
  CompressedTuple<unsigned_long,_phmap::priv::HashEq<cs::token_base_*,_void>::Hash,_phmap::priv::HashEq<cs::token_base_*,_void>::Eq,_std::allocator<cs::token_base_*>_>
  ::CompressedTuple((CompressedTuple<unsigned_long,_phmap::priv::HashEq<cs::token_base_*,_void>::Hash,_phmap::priv::HashEq<cs::token_base_*,_void>::Eq,_std::allocator<cs::token_base_*>_>
                     *)(in_RDI + 5),0,local_b);
  std::allocator<cs::token_base_*>::~allocator((allocator<cs::token_base_*> *)0x218230);
  return;
}

Assistant:

raw_hash_set() noexcept(
			    std::is_nothrow_default_constructible<hasher>::value&&
			    std::is_nothrow_default_constructible<key_equal>::value&&
			    std::is_nothrow_default_constructible<allocator_type>::value) {}